

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

void __thiscall
node::BlockManager::UnlinkPrunedFiles
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  FlatFilePos *in_RDI;
  long in_FS_OFFSET;
  bool removed_undofile;
  bool removed_blockfile;
  FlatFilePos pos;
  iterator it;
  error_code ec;
  Level in_stack_000000b0;
  char (*in_stack_000000c0) [18];
  int *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  reference in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  FlatFileSeq *in_stack_ffffffffffffff40;
  LogFlags in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  error_code local_68 [2];
  ConstevalFormatString<2U> in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::set<int,_std::less<int>,_std::allocator<int>_>::begin
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff10);
  while( true ) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::end
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff10);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff18,(_Self *)in_stack_ffffffffffffff10);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    FlatFilePos::FlatFilePos
              ((FlatFilePos *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0,
               0x377adc);
    FlatFileSeq::FileName(in_stack_ffffffffffffff40,in_RDI);
    bVar3 = std::filesystem::remove((path *)&stack0xffffffffffffffd0,local_68);
    fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    FlatFileSeq::FileName(in_stack_ffffffffffffff40,in_RDI);
    bVar4 = std::filesystem::remove((path *)(local_68 + 1),local_68);
    fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if ((((bVar3 & 1) != 0) || ((bVar4 & 1) != 0)) &&
       (bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                    Trace), bVar2)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff10 = "Prune: %s deleted blk/rev (%05u)\n";
      in_stack_ffffffffffffff20 =
           std::_Rb_tree_const_iterator<int>::operator*
                     ((_Rb_tree_const_iterator<int> *)
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      in_stack_ffffffffffffff08 = 1;
      in_stack_ffffffffffffff18 = "UnlinkPrunedFiles";
      in_stack_ffffffffffffff40 = (FlatFileSeq *)in_stack_ffffffffffffff10;
      LogPrintFormatInternal<char[18],int>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff70,in_stack_000000b0,in_stack_ffffffffffffffb8,
                 in_stack_000000c0,in_stack_000000c8);
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::UnlinkPrunedFiles(const std::set<int>& setFilesToPrune) const
{
    std::error_code ec;
    for (std::set<int>::iterator it = setFilesToPrune.begin(); it != setFilesToPrune.end(); ++it) {
        FlatFilePos pos(*it, 0);
        const bool removed_blockfile{fs::remove(m_block_file_seq.FileName(pos), ec)};
        const bool removed_undofile{fs::remove(m_undo_file_seq.FileName(pos), ec)};
        if (removed_blockfile || removed_undofile) {
            LogDebug(BCLog::BLOCKSTORAGE, "Prune: %s deleted blk/rev (%05u)\n", __func__, *it);
        }
    }
}